

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.h
# Opt level: O2

void __thiscall spvtools::opt::VectorDCE::VectorDCE(VectorDCE *this)

{
  uint32_t i;
  uint32_t i_00;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__VectorDCE_008ad698;
  utils::BitVector::BitVector(&this->all_components_live_,0x10);
  for (i_00 = 0; i_00 != 0x10; i_00 = i_00 + 1) {
    utils::BitVector::Set(&this->all_components_live_,i_00);
  }
  return;
}

Assistant:

VectorDCE() : all_components_live_(kMaxVectorSize) {
    for (uint32_t i = 0; i < kMaxVectorSize; i++) {
      all_components_live_.Set(i);
    }
  }